

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O2

void fct_junit_logger__on_test_suite_end(fct_logger_i *logger_,fct_logger_evt_t *e)

{
  fct_ts_t *ts;
  int iVar1;
  fct_test_t *pfVar2;
  size_t sVar3;
  size_t sVar4;
  void *pvVar5;
  ulong uVar6;
  size_t sVar7;
  size_t idx;
  char *pcVar8;
  bool bVar9;
  double dVar10;
  double local_458;
  char std_buffer [1024];
  
  ts = e->ts;
  if (ts != (fct_ts_t *)0x0) {
    sVar3 = (ts->test_list).used_itm_num;
    local_458 = 0.0;
    for (sVar7 = 0; sVar3 != sVar7; sVar7 = sVar7 + 1) {
      pfVar2 = (fct_test_t *)fct_nlist__at(&ts->test_list,sVar7);
      dVar10 = fct_test__duration(pfVar2);
      local_458 = local_458 + dVar10;
    }
    fct_switch_std_to_std(_stdout,1,fct_saved_stdout);
    fct_switch_std_to_std(_stderr,2,fct_saved_stderr);
    sVar3 = fct_ts__tst_cnt(ts);
    sVar7 = fct_ts__tst_cnt_passed(ts);
    sVar4 = fct_ts__tst_cnt(ts);
    printf("\t<testsuite errors=\"%lu\" failures=\"0\" tests=\"%lu\" name=\"%s\" time=\"%.4f\">\n",
           local_458,sVar3 - sVar7,sVar4,ts->name);
    sVar3 = (ts->test_list).used_itm_num;
    for (sVar7 = 0; sVar7 != sVar3; sVar7 = sVar7 + 1) {
      pfVar2 = (fct_test_t *)fct_nlist__at(&ts->test_list,sVar7);
      iVar1 = fct_test__is_pass(pfVar2);
      fct_test__duration(pfVar2);
      pcVar8 = "\t\t<testcase name=\"%s\" time=\"%.3f\"";
      if (iVar1 == 0) {
        pcVar8 = "\t\t<testcase name=\"%s\" time=\"%.3f\">\n";
      }
      printf(pcVar8,pfVar2->name);
      if (pfVar2 != (fct_test_t *)0x0) {
        sVar4 = (pfVar2->failed_chks).used_itm_num;
        for (idx = 0; sVar4 != idx; idx = idx + 1) {
          pvVar5 = fct_nlist__at((fct_nlist_t *)pfVar2,idx);
          printf("\t\t\t<error message=\"%s\" type=\"fctx\">",(long)pvVar5 + 0x208);
          printf("file:%s, line:%d",(long)pvVar5 + 0x100,(ulong)*(uint *)((long)pvVar5 + 0x200));
          puts("</error>");
        }
      }
      pcVar8 = " />";
      if (iVar1 == 0) {
        pcVar8 = "\t\t</testcase>";
      }
      puts(pcVar8);
    }
    bVar9 = false;
    printf("\t\t<system-out>\n\t\t\t<![CDATA[");
    while( true ) {
      uVar6 = read(fct_stdout_pipe[0],std_buffer,0x400);
      if ((int)uVar6 < 1) break;
      if (!bVar9) {
        putchar(10);
      }
      printf("%.*s",uVar6 & 0xffffffff,std_buffer);
      bVar9 = true;
    }
    puts("]]>\n\t\t</system-out>");
    bVar9 = false;
    printf("\t\t<system-err>\n\t\t\t<![CDATA[");
    while( true ) {
      uVar6 = read(fct_stderr_pipe[0],std_buffer,0x400);
      if ((int)uVar6 < 1) break;
      if (!bVar9) {
        putchar(10);
      }
      printf("%.*s",uVar6 & 0xffffffff,std_buffer);
      bVar9 = true;
    }
    puts("]]>\n\t\t</system-err>");
    puts("\t</testsuite>");
    return;
  }
  __assert_fail("ts != __null",
                "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",0x54e,
                "double fct_ts__duration(const fct_ts_t *)");
}

Assistant:

static void
fct_junit_logger__on_test_suite_end(
    fct_logger_i *logger_,
    fct_logger_evt_t const *e
)
{
    fct_ts_t const *ts = e->ts; /* Test Suite */
    nbool_t is_pass;
    double elasped_time = 0;
    char std_buffer[1024];
    int read_length;
    int first_out_line;

    fct_unused(logger_);

    elasped_time = fct_ts__duration(ts);

    FCT_SWITCH_STDOUT_TO_STDOUT();
    FCT_SWITCH_STDERR_TO_STDERR();

    /* opening testsuite tag */
    printf("\t<testsuite errors=\"%lu\" failures=\"0\" tests=\"%lu\" "
           "name=\"%s\" time=\"%.4f\">\n",
           (unsigned long)   fct_ts__tst_cnt(ts)
           - fct_ts__tst_cnt_passed(ts),
           (unsigned long) fct_ts__tst_cnt(ts),
           fct_ts__name(ts),
           elasped_time);

    FCT_NLIST_FOREACH_BGN(fct_test_t*, test, &(ts->test_list))
    {
        is_pass = fct_test__is_pass(test);

        /* opening testcase tag */
        if (is_pass)
        {
            printf("\t\t<testcase name=\"%s\" time=\"%.3f\"",
                   fct_test__name(test),
                   fct_test__duration(test)
                  );
        }
        else
        {
            printf("\t\t<testcase name=\"%s\" time=\"%.3f\">\n",
                   fct_test__name(test),
                   fct_test__duration(test)
                  );
        }

        FCT_NLIST_FOREACH_BGN(fctchk_t*, chk, &(test->failed_chks))
        {
            /* error tag */
            printf("\t\t\t<error message=\"%s\" "
                   "type=\"fctx\">", chk->msg);
            printf("file:%s, line:%d", chk->file, chk->lineno);
            printf("</error>\n");
        }
        FCT_NLIST_FOREACH_END();

        /* closing testcase tag */
        if (is_pass)
        {
            printf(" />\n");
        }
        else
        {
            printf("\t\t</testcase>\n");
        }
    }
    FCT_NLIST_FOREACH_END();

    /* print the std streams */
    first_out_line = 1;
    printf("\t\t<system-out>\n\t\t\t<![CDATA[");
    while ( (read_length = _fct_read(fct_stdout_pipe[0], std_buffer, 1024)) > 0)
    {
        if (first_out_line)
        {
            printf("\n");
            first_out_line = 0;
        }
        printf("%.*s", read_length, std_buffer);
    }
    printf("]]>\n\t\t</system-out>\n");

    first_out_line = 1;
    printf("\t\t<system-err>\n\t\t\t<![CDATA[");
    while ((read_length = _fct_read(fct_stderr_pipe[0], std_buffer, 1024)) > 0)
    {
        if (first_out_line)
        {
            printf("\n");
            first_out_line = 0;
        }
        printf("%.*s", read_length, std_buffer);
    }
    printf("]]>\n\t\t</system-err>\n");

    /* closing testsuite tag */
    printf("\t</testsuite>\n");
}